

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc-3339_type.h
# Opt level: O1

bool date::rfc3339::validate(parts *dt)

{
  byte bVar1;
  ushort uVar2;
  bool bVar3;
  uint uVar4;
  ushort uVar5;
  byte bVar6;
  bool bVar7;
  
  uVar2 = dt->year;
  uVar4 = (uint)uVar2;
  if (((uVar2 == 0) || (bVar1 = dt->month, (byte)(bVar1 - 0xd) < 0xf4)) || (dt->day == 0)) {
    return false;
  }
  if (bVar1 < 0xc) {
    bVar6 = 0x1e;
    if ((0xa50U >> (bVar1 & 0x1f) & 1) != 0) goto LAB_00109263;
    if (bVar1 == 2) {
      bVar6 = 0x1c;
      if ((uVar2 & 3) == 0) {
        bVar6 = 0x1d;
        if ((uVar4 * -0x3d70a3d7 >> 2 | uVar4 * 0x40000000) < 0x28f5c29) {
          bVar6 = (uVar4 * -0x3d70a3d7 >> 4 | uVar4 * -0x70000000) < 0xa3d70b | 0x1c;
        }
      }
      goto LAB_00109263;
    }
  }
  bVar6 = 0x1f;
LAB_00109263:
  bVar3 = false;
  bVar7 = false;
  if (((dt->day <= bVar6) && (bVar7 = bVar3, dt->hour < 0x18)) &&
     ((dt->minute < 0x3c && ((dt->second < 0x3c && (dt->nanosecond < 1000000000)))))) {
    uVar2 = dt->offset_in_minutes;
    uVar5 = -uVar2;
    if (0 < (short)uVar2) {
      uVar5 = uVar2;
    }
    bVar7 = uVar5 < 0x5a0;
  }
  return bVar7;
}

Assistant:

static bool validate(const parts& dt)
    {
        if (dt.year == 0)
            return false;
        if (dt.month == 0 || dt.month > 12)
            return false;
        if (dt.day == 0 || dt.day > calendar_helper::days_in_month(dt.year, dt.month))
            return false;
        if (dt.hour > 23)
            return false;
        if (dt.minute > 59)
            return false;
        if (dt.second > 59)
            return false;
        if (dt.nanosecond > 999999999)
            return false;
        if (std::abs(dt.offset_in_minutes) > 1439)
            return false;
        return true;
    }